

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int i;
  int iVar1;
  ImGuiTabBar *pIVar2;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Buf,i + 1);
    iVar1 = this->FreeIdx + 1;
  }
  else {
    pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
    iVar1 = (pIVar2->Tabs).Size;
  }
  this->FreeIdx = iVar1;
  pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
  (pIVar2->BarRect).Min.x = 0.0;
  (pIVar2->BarRect).Min.y = 0.0;
  (pIVar2->BarRect).Max.x = 0.0;
  (pIVar2->BarRect).Max.y = 0.0;
  (pIVar2->Tabs).Size = 0;
  (pIVar2->Tabs).Capacity = 0;
  (pIVar2->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar2->ID = 0;
  pIVar2->SelectedTabId = 0;
  pIVar2->NextSelectedTabId = 0;
  pIVar2->VisibleTabId = 0;
  (pIVar2->TabsNames).Buf.Data = (char *)0x0;
  (pIVar2->FramePadding).x = 0.0;
  (pIVar2->FramePadding).y = 0.0;
  (pIVar2->TabsNames).Buf.Size = 0;
  (pIVar2->TabsNames).Buf.Capacity = 0;
  pIVar2->CurrFrameVisible = -1;
  pIVar2->PrevFrameVisible = -1;
  pIVar2->LastTabContentHeight = 0.0;
  pIVar2->OffsetMax = 0.0;
  pIVar2->OffsetMaxIdeal = 0.0;
  pIVar2->OffsetNextTab = 0.0;
  pIVar2->ScrollingAnim = 0.0;
  pIVar2->ScrollingTarget = 0.0;
  pIVar2->ScrollingTargetDistToVisibility = 0.0;
  pIVar2->ScrollingSpeed = 0.0;
  *(undefined8 *)((long)&pIVar2->ScrollingTargetDistToVisibility + 3) = 0;
  *(undefined8 *)((long)&pIVar2->Flags + 3) = 0;
  pIVar2->LastTabItemIdx = -1;
  pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
  return pIVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }